

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void * __thiscall mymalloc::Heap::malloc(Heap *this,size_t __size)

{
  CacheMap *this_00;
  void *pvVar1;
  iterator iVar2;
  Cache *this_01;
  mapped_type *ppCVar3;
  uint size;
  id id;
  
  size = (uint)__size;
  if ((int)size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JameyWoo[P]mymalloc/heap.cpp"
                  ,0x12,"void *mymalloc::Heap::malloc(int)");
  }
  if (0x8000 < size) {
    pvVar1 = bigObjectMalloc(this,size);
    return pvVar1;
  }
  id._M_thread = pthread_self();
  this_00 = &this->cacheMap;
  iVar2 = std::
          _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_Cache_*>,_std::_Select1st<std::pair<const_std::thread::id,_Cache_*>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
          ::find(&this_00->_M_t,&id);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->cacheMap)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (Cache *)operator_new(0xed8);
    Cache::Cache(this_01,(Central *)&this->field_0x60,&this->spanMap);
    ppCVar3 = std::
              map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
              ::operator[](this_00,&id);
    *ppCVar3 = this_01;
  }
  ppCVar3 = std::
            map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
            ::operator[](this_00,&id);
  pvVar1 = Cache::malloc(*ppCVar3,__size & 0xffffffff);
  return pvVar1;
}

Assistant:

void *mymalloc::Heap::malloc(int size) {
    assert(size > 0);  // 要分配内存必须size > 0
    if (size > maxSmallObjectSize) {  // 大对象分配
        return bigObjectMalloc(size);
    }

    Cache* cache;
    auto id = std::this_thread::get_id();
    // 选择对应的 Cache结构来进行内存分配
    if (this->cacheMap.find(id) == this->cacheMap.end()) {
        // 如果没有当前线程id的缓存结构, 那么创建一个
        cache = new Cache(this->ctls, &this->spanMap);
        this->cacheMap[id] = cache;  // 把 central 数组的地址传进去
    }
    cache = this->cacheMap[id];
    return cache->malloc(size);
}